

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unzLocateFile(unzFile file,char *szFileName,int iCaseSensitivity)

{
  unz_file_info64 *pfile_info;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  unz64_s *s;
  unz_file_info64 cur_file_infoSaved;
  char szCurrentFileName [257];
  undefined1 local_1c0 [136];
  char local_138 [264];
  
  iVar5 = -0x66;
  if ((file != (unzFile)0x0) && (sVar6 = strlen(szFileName), sVar6 < 0x100)) {
    if (*(long *)((long)file + 0x90) == 0) {
      iVar5 = -100;
    }
    else {
      uVar1 = *(undefined8 *)((long)file + 0x80);
      uVar2 = *(undefined8 *)((long)file + 0x88);
      pfile_info = (unz_file_info64 *)((long)file + 0xb0);
      memcpy(local_1c0,pfile_info,0x88);
      uVar3 = *(undefined8 *)((long)file + 0x138);
      *(undefined8 *)((long)file + 0x88) = *(undefined8 *)((long)file + 0xa8);
      *(undefined8 *)((long)file + 0x80) = 0;
      iVar5 = unz64local_GetCurrentFileInfoInternal
                        (file,pfile_info,(unz_file_info64_internal *)((long)file + 0x138),
                         (char *)0x0,0,(void *)0x0,0,(char *)0x0,0);
      *(ulong *)((long)file + 0x90) = (ulong)(iVar5 == 0);
      do {
        if (iVar5 != 0) {
          *(undefined8 *)((long)file + 0x80) = uVar1;
          *(undefined8 *)((long)file + 0x88) = uVar2;
          memcpy(pfile_info,local_1c0,0x88);
          *(undefined8 *)((long)file + 0x138) = uVar3;
          return iVar5;
        }
        iVar5 = unz64local_GetCurrentFileInfoInternal
                          (file,(unz_file_info64 *)0x0,(unz_file_info64_internal *)0x0,local_138,
                           0x100,(void *)0x0,0,(char *)0x0,0);
        bVar4 = true;
        if (iVar5 == 0) {
          iVar5 = unzStringFileNameCompare(local_138,szFileName,iCaseSensitivity);
          if (iVar5 == 0) {
            iVar5 = 0;
            bVar4 = false;
          }
          else {
            iVar5 = unzGoToNextFile(file);
          }
        }
      } while (bVar4);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

extern int ZEXPORT unzLocateFile(unzFile file, const char* szFileName, int iCaseSensitivity)
{
    unz64_s* s;
    int err;

    /* We remember the 'current' position in the file so that we can jump
     * back there if we fail.
     */
    unz_file_info64 cur_file_infoSaved;
    unz_file_info64_internal cur_file_info_internalSaved;
    ZPOS64_T num_fileSaved;
    ZPOS64_T pos_in_central_dirSaved;


    if (file == NULL)
        return UNZ_PARAMERROR;

    if (strlen(szFileName) >= UNZ_MAXFILENAMEINZIP)
        return UNZ_PARAMERROR;

    s = (unz64_s*)file;
    if (!s->current_file_ok)
        return UNZ_END_OF_LIST_OF_FILE;

    /* Save the current state */
    num_fileSaved = s->num_file;
    pos_in_central_dirSaved = s->pos_in_central_dir;
    cur_file_infoSaved = s->cur_file_info;
    cur_file_info_internalSaved = s->cur_file_info_internal;

    err = unzGoToFirstFile(file);

    while (err == UNZ_OK)
    {
        char szCurrentFileName[UNZ_MAXFILENAMEINZIP + 1];
        err = unzGetCurrentFileInfo64(file, NULL,
            szCurrentFileName, sizeof(szCurrentFileName) - 1,
            NULL, 0, NULL, 0);
        if (err == UNZ_OK)
        {
            if (unzStringFileNameCompare(szCurrentFileName,
                szFileName, iCaseSensitivity) == 0)
                return UNZ_OK;
            err = unzGoToNextFile(file);
        }
    }

    /* We failed, so restore the state of the 'current file' to where we
     * were.
     */
    s->num_file = num_fileSaved;
    s->pos_in_central_dir = pos_in_central_dirSaved;
    s->cur_file_info = cur_file_infoSaved;
    s->cur_file_info_internal = cur_file_info_internalSaved;
    return err;
}